

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O1

void aom_img_metadata_array_free(aom_metadata_array_t *arr)

{
  ulong uVar1;
  
  if (arr != (aom_metadata_array_t *)0x0) {
    if (arr->metadata_array != (aom_metadata_t **)0x0) {
      if (arr->sz != 0) {
        uVar1 = 0;
        do {
          aom_img_metadata_free(arr->metadata_array[uVar1]);
          uVar1 = uVar1 + 1;
        } while (uVar1 < arr->sz);
      }
      free(arr->metadata_array);
    }
    free(arr);
    return;
  }
  return;
}

Assistant:

void aom_img_metadata_array_free(aom_metadata_array_t *arr) {
  if (arr) {
    if (arr->metadata_array) {
      for (size_t i = 0; i < arr->sz; i++) {
        aom_img_metadata_free(arr->metadata_array[i]);
      }
      free(arr->metadata_array);
    }
    free(arr);
  }
}